

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall kj::HttpServer::listenHttp(HttpServer *this,ConnectionReceiver *port)

{
  undefined8 uVar1;
  HttpHeaderTable *pHVar2;
  undefined1 local_48 [16];
  HttpHeaderTable *local_38;
  SourceLocation local_30;
  
  listenLoop((HttpServer *)local_48,port);
  kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)(local_48 + 8));
  local_30.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_30.function = "listenHttp";
  local_30.lineNumber = 0x1fda;
  local_30.columnNumber = 10;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
            ((PromiseDisposer *)&local_38,(OwnPromiseNode *)local_48,
             (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_48 + 8),&local_30);
  pHVar2 = local_38;
  uVar1 = local_48._8_8_;
  local_38 = (HttpHeaderTable *)0x0;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)pHVar2;
  if ((PromiseArenaMember *)local_48._8_8_ != (PromiseArenaMember *)0x0) {
    local_48._8_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  uVar1 = local_48._0_8_;
  if ((PromiseArenaMember *)local_48._0_8_ != (PromiseArenaMember *)0x0) {
    local_48._0_8_ = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpServer::listenHttp(kj::ConnectionReceiver& port) {
  return listenLoop(port).exclusiveJoin(onDrain.addBranch());
}